

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

void __thiscall
llvm::
DenseMapBase<llvm::DenseMap<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>,_unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>
::moveFromOldBuckets
          (DenseMapBase<llvm::DenseMap<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>,_unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>
           *this,DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>
                 *OldBucketsBegin,
          DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*> *OldBucketsEnd)

{
  bool bVar1;
  DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*> *local_30;
  DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*> *DestBucket;
  
  initEmpty(this);
  do {
    if (OldBucketsBegin == OldBucketsEnd) {
      return;
    }
    if ((OldBucketsBegin->super_pair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>).first
        < 0xfffffffffffffffe) {
      bVar1 = LookupBucketFor<unsigned_long>(this,(unsigned_long *)OldBucketsBegin,&local_30);
      if (bVar1) {
        __assert_fail("!FoundVal && \"Key already in new map?\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/DenseMap.h"
                      ,0x17a,
                      "void llvm::DenseMapBase<llvm::DenseMap<unsigned long, const llvm::DWARFDebugNames::NameIndex *>, unsigned long, const llvm::DWARFDebugNames::NameIndex *, llvm::DenseMapInfo<unsigned long>, llvm::detail::DenseMapPair<unsigned long, const llvm::DWARFDebugNames::NameIndex *>>::moveFromOldBuckets(BucketT *, BucketT *) [DerivedT = llvm::DenseMap<unsigned long, const llvm::DWARFDebugNames::NameIndex *>, KeyT = unsigned long, ValueT = const llvm::DWARFDebugNames::NameIndex *, KeyInfoT = llvm::DenseMapInfo<unsigned long>, BucketT = llvm::detail::DenseMapPair<unsigned long, const llvm::DWARFDebugNames::NameIndex *>]"
                     );
      }
      (local_30->super_pair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>).first =
           (OldBucketsBegin->super_pair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>).
           first;
      (local_30->super_pair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>).second =
           (OldBucketsBegin->super_pair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>).
           second;
      *(int *)(this + 8) = *(int *)(this + 8) + 1;
    }
    OldBucketsBegin = OldBucketsBegin + 1;
  } while( true );
}

Assistant:

void moveFromOldBuckets(BucketT *OldBucketsBegin, BucketT *OldBucketsEnd) {
    initEmpty();

    // Insert all the old elements.
    const KeyT EmptyKey = getEmptyKey();
    const KeyT TombstoneKey = getTombstoneKey();
    for (BucketT *B = OldBucketsBegin, *E = OldBucketsEnd; B != E; ++B) {
      if (!KeyInfoT::isEqual(B->getFirst(), EmptyKey) &&
          !KeyInfoT::isEqual(B->getFirst(), TombstoneKey)) {
        // Insert the key/value into the new table.
        BucketT *DestBucket;
        bool FoundVal = LookupBucketFor(B->getFirst(), DestBucket);
        (void)FoundVal; // silence warning.
        assert(!FoundVal && "Key already in new map?");
        DestBucket->getFirst() = std::move(B->getFirst());
        ::new (&DestBucket->getSecond()) ValueT(std::move(B->getSecond()));
        incrementNumEntries();

        // Free the value.
        B->getSecond().~ValueT();
      }
      B->getFirst().~KeyT();
    }
  }